

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

longlong __thiscall mkvparser::Cluster::GetTime(Cluster *this)

{
  SegmentInfo *pSVar1;
  long lVar2;
  longlong lVar3;
  
  lVar3 = GetTimeCode(this);
  if (-1 < lVar3) {
    pSVar1 = this->m_pSegment->m_pInfo;
    if (pSVar1 == (SegmentInfo *)0x0) {
      __assert_fail("pInfo",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1bc8,"long long mkvparser::Cluster::GetTime() const");
    }
    lVar2 = pSVar1->m_timecodeScale;
    if (lVar2 < 1) {
      __assert_fail("scale >= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1bcb,"long long mkvparser::Cluster::GetTime() const");
    }
    lVar3 = lVar2 * this->m_timecode;
  }
  return lVar3;
}

Assistant:

long long Cluster::GetTime() const {
  const long long tc = GetTimeCode();

  if (tc < 0)
    return tc;

  const SegmentInfo* const pInfo = m_pSegment->GetInfo();
  assert(pInfo);

  const long long scale = pInfo->GetTimeCodeScale();
  assert(scale >= 1);

  const long long t = m_timecode * scale;

  return t;
}